

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O2

int run_test_loop_handles(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(uVar2,&prepare_1_handle);
  if (iVar1 == 0) {
    iVar1 = uv_prepare_start(&prepare_1_handle,prepare_1_cb);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_check_init(uVar2,&check_handle);
      if (iVar1 == 0) {
        iVar1 = uv_check_start(&check_handle,check_cb);
        if (iVar1 == 0) {
          uVar2 = uv_default_loop();
          iVar1 = uv_prepare_init(uVar2,&prepare_2_handle);
          if (iVar1 == 0) {
            lVar3 = 0;
            do {
              uVar2 = uv_default_loop();
              if (lVar3 + 0x78 == 0x3c0) {
                iVar1 = uv_timer_init(uVar2,&timer_handle);
                if (iVar1 == 0) {
                  iVar1 = uv_timer_start(&timer_handle,timer_cb,100);
                  if (iVar1 == 0) {
                    uv_unref(&timer_handle);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_run(uVar2,0);
                    if (iVar1 == 0) {
                      if (loop_iteration == 0x15) {
                        if (prepare_1_cb_called == 0x15) {
                          if (prepare_1_close_cb_called == 1) {
                            if (prepare_2_cb_called == 10) {
                              if (prepare_2_close_cb_called == 1) {
                                if (check_cb_called == 0x15) {
                                  if (check_close_cb_called == 1) {
                                    if (idle_1_close_cb_called == 7) {
                                      if (idle_2_close_cb_called == idle_2_cb_started) {
                                        if (idle_2_is_active == '\x01') {
                                          pcVar4 = "idle_2_is_active == 0";
                                          uVar2 = 0x14d;
                                        }
                                        else {
                                          uVar2 = uv_default_loop();
                                          uv_walk(uVar2,close_walk_cb,0);
                                          uv_run(uVar2,0);
                                          uVar2 = uv_default_loop();
                                          iVar1 = uv_loop_close(uVar2);
                                          if (iVar1 == 0) {
                                            return 0;
                                          }
                                          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                          uVar2 = 0x14f;
                                        }
                                      }
                                      else {
                                        pcVar4 = "idle_2_close_cb_called == idle_2_cb_started";
                                        uVar2 = 0x14c;
                                      }
                                    }
                                    else {
                                      pcVar4 = "idle_1_close_cb_called == IDLE_COUNT";
                                      uVar2 = 0x14a;
                                    }
                                  }
                                  else {
                                    pcVar4 = "check_close_cb_called == 1";
                                    uVar2 = 0x147;
                                  }
                                }
                                else {
                                  pcVar4 = "check_cb_called == ITERATIONS";
                                  uVar2 = 0x146;
                                }
                              }
                              else {
                                pcVar4 = "prepare_2_close_cb_called == 1";
                                uVar2 = 0x144;
                              }
                            }
                            else {
                              pcVar4 = "prepare_2_cb_called == ITERATIONS / 2";
                              uVar2 = 0x143;
                            }
                          }
                          else {
                            pcVar4 = "prepare_1_close_cb_called == 1";
                            uVar2 = 0x141;
                          }
                        }
                        else {
                          pcVar4 = "prepare_1_cb_called == ITERATIONS";
                          uVar2 = 0x140;
                        }
                      }
                      else {
                        pcVar4 = "loop_iteration == ITERATIONS";
                        uVar2 = 0x13e;
                      }
                    }
                    else {
                      pcVar4 = "r == 0";
                      uVar2 = 0x13c;
                    }
                  }
                  else {
                    pcVar4 = "r == 0";
                    uVar2 = 0x138;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uVar2 = 0x136;
                }
                goto LAB_0013ca03;
              }
              iVar1 = uv_idle_init(uVar2,(long)idle_1_handles[0].handle_queue + lVar3 + -0x20);
              lVar3 = lVar3 + 0x78;
            } while (iVar1 == 0);
            pcVar4 = "r == 0";
            uVar2 = 0x12e;
          }
          else {
            pcVar4 = "r == 0";
            uVar2 = 0x129;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar2 = 0x125;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar2 = 0x123;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar2 = 0x120;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar2 = 0x11e;
  }
LAB_0013ca03:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(loop_handles) {
  int i;
  int r;

  r = uv_prepare_init(uv_default_loop(), &prepare_1_handle);
  ASSERT(r == 0);
  r = uv_prepare_start(&prepare_1_handle, prepare_1_cb);
  ASSERT(r == 0);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT(r == 0);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT(r == 0);

  /* initialize only, prepare_2 is started by prepare_1_cb */
  r = uv_prepare_init(uv_default_loop(), &prepare_2_handle);
  ASSERT(r == 0);

  for (i = 0; i < IDLE_COUNT; i++) {
    /* initialize only, idle_1 handles are started by check_cb */
    r = uv_idle_init(uv_default_loop(), &idle_1_handles[i]);
    ASSERT(r == 0);
  }

  /* don't init or start idle_2, both is done by idle_1_cb */

  /* The timer callback is there to keep the event loop polling unref it as it
   * is not supposed to keep the loop alive */
  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT(r == 0);
  r = uv_timer_start(&timer_handle, timer_cb, TIMEOUT, TIMEOUT);
  ASSERT(r == 0);
  uv_unref((uv_handle_t*)&timer_handle);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(loop_iteration == ITERATIONS);

  ASSERT(prepare_1_cb_called == ITERATIONS);
  ASSERT(prepare_1_close_cb_called == 1);

  ASSERT(prepare_2_cb_called == ITERATIONS / 2);
  ASSERT(prepare_2_close_cb_called == 1);

  ASSERT(check_cb_called == ITERATIONS);
  ASSERT(check_close_cb_called == 1);

  /* idle_1_cb should be called a lot */
  ASSERT(idle_1_close_cb_called == IDLE_COUNT);

  ASSERT(idle_2_close_cb_called == idle_2_cb_started);
  ASSERT(idle_2_is_active == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}